

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O2

bool tcu::floatThresholdCompare
               (TestLog *log,char *imageSetName,char *imageSetDesc,Vec4 *reference,
               ConstPixelBufferAccess *result,Vec4 *threshold,CompareLogMode logMode)

{
  ostringstream *poVar1;
  TestLog *this;
  bool bVar2;
  TextureChannelClass TVar3;
  int iVar4;
  Vec4 *bias;
  ConstPixelBufferAccess *pCVar5;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  int x;
  int iVar6;
  string *this_00;
  int iVar7;
  int iVar8;
  allocator<char> local_411;
  ConstPixelBufferAccess *local_410;
  int local_408;
  int local_404;
  allocator<char> local_3fd;
  allocator<char> local_3fc;
  allocator<char> local_3fb;
  allocator<char> local_3fa;
  allocator<char> local_3f9;
  Vec4 *local_3f8;
  int local_3f0;
  int local_3ec;
  Vec4 local_3e8;
  Vec4 local_3d8;
  char *local_3c0;
  char *local_3b8;
  Vec4 *local_3b0;
  Vector<float,_4> local_3a8;
  TestLog *local_398;
  string local_390;
  string local_370;
  string local_350;
  undefined1 local_330 [8];
  size_type sStack_328;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  PixelBufferAccess errorMask;
  TextureLevel errorMaskStorage;
  Vec4 diff;
  Vec4 cmpPix;
  
  iVar8 = (result->m_size).m_data[0];
  iVar4 = (result->m_size).m_data[1];
  iVar6 = (result->m_size).m_data[2];
  cmpPix.m_data[0] = 9.80909e-45;
  cmpPix.m_data[1] = 4.2039e-45;
  local_410 = result;
  local_3f8 = threshold;
  local_3c0 = imageSetDesc;
  local_3b8 = imageSetName;
  local_3b0 = reference;
  local_398 = log;
  TextureLevel::TextureLevel(&errorMaskStorage,(TextureFormat *)&cmpPix,iVar8,iVar4,iVar6);
  TextureLevel::getAccess(&errorMask,&errorMaskStorage);
  local_3a8.m_data[0] = 0.0;
  local_3a8.m_data[1] = 0.0;
  local_3a8.m_data[2] = 0.0;
  local_3a8.m_data[3] = 0.0;
  local_3d8.m_data[0] = 0.0;
  local_3d8.m_data[1] = 0.0;
  local_3d8.m_data[2] = 0.0;
  local_3d8.m_data[3] = 0.0;
  local_3e8.m_data[0] = 1.0;
  local_3e8.m_data[1] = 1.0;
  local_3e8.m_data[2] = 1.0;
  local_3e8.m_data[3] = 1.0;
  iVar7 = 0;
  if (iVar8 < 1) {
    iVar8 = 0;
  }
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  local_3f0 = iVar6;
  if (iVar6 < 1) {
    local_3f0 = iVar7;
  }
  local_3ec = iVar4;
  for (; iVar7 != local_3f0; iVar7 = iVar7 + 1) {
    iVar4 = 0;
    local_408 = iVar7;
    while (iVar4 != local_3ec) {
      iVar6 = 0;
      local_404 = iVar4;
      while( true ) {
        if (iVar8 == iVar6) break;
        ConstPixelBufferAccess::getPixel
                  ((ConstPixelBufferAccess *)&cmpPix,(int)local_410,iVar6,local_404);
        operator-((tcu *)local_330,local_3b0,(Vector<float,_4> *)&cmpPix);
        abs<float,4>((tcu *)&diff,(Vector<float,_4> *)local_330);
        lessThanEqual<float,4>((tcu *)local_330,(Vector<float,_4> *)&diff,local_3f8);
        bVar2 = boolAll<4>((Vector<bool,_4> *)local_330);
        max<float,4>((tcu *)local_330,&local_3a8,(Vector<float,_4> *)&diff);
        local_3a8.m_data[1] = (float)local_330._4_4_;
        local_3a8.m_data[0] = (float)local_330._0_4_;
        local_3a8.m_data[2] = (float)(undefined4)sStack_328;
        local_3a8.m_data[3] = (float)sStack_328._4_4_;
        local_330._4_4_ = 0.0;
        if (bVar2) {
          local_330._0_4_ = 0.0;
          local_330._4_4_ = 1.0;
        }
        else {
          local_330._0_4_ = 1.0;
        }
        sStack_328 = 0x3f80000000000000;
        PixelBufferAccess::setPixel(&errorMask,(Vec4 *)local_330,iVar6,local_404,local_408);
        iVar6 = iVar6 + 1;
        iVar7 = local_408;
      }
      iVar4 = local_404 + 1;
    }
  }
  lessThanEqual<float,4>((tcu *)&cmpPix,&local_3a8,local_3f8);
  bVar2 = boolAll<4>((Vector<bool,_4> *)&cmpPix);
  this = local_398;
  bias = (Vec4 *)(ulong)logMode;
  iVar8 = (int)local_398;
  if (logMode == COMPARE_LOG_EVERYTHING || !bVar2) {
    TVar3 = getTextureChannelClass((local_410->m_format).type);
    if (TVar3 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      bias = &local_3d8;
      anon_unknown_50::computeScaleAndBias(local_410,local_410,&local_3e8,bias);
      poVar1 = (ostringstream *)(cmpPix.m_data + 2);
      cmpPix.m_data._0_8_ = this;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Result image is normalized with formula p * ");
      operator<<((ostream *)poVar1,&local_3e8);
      std::operator<<((ostream *)poVar1," + ");
      operator<<((ostream *)poVar1,&local_3d8);
      MessageBuilder::operator<<((MessageBuilder *)&cmpPix,(EndMessageToken *)&TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
    }
    if (!bVar2) {
      poVar1 = (ostringstream *)(cmpPix.m_data + 2);
      cmpPix.m_data._0_8_ = this;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Image comparison failed: max difference = ");
      operator<<((ostream *)poVar1,&local_3a8);
      std::operator<<((ostream *)poVar1,", threshold = ");
      operator<<((ostream *)poVar1,local_3f8);
      std::operator<<((ostream *)poVar1,", reference = ");
      operator<<((ostream *)poVar1,local_3b0);
      MessageBuilder::operator<<((MessageBuilder *)&cmpPix,(EndMessageToken *)&TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_350,local_3b8,&local_411);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,local_3c0,&local_3f9);
    LogImageSet::LogImageSet((LogImageSet *)local_330,&local_350,&local_370);
    LogImageSet::write((LogImageSet *)local_330,iVar8,__buf_01,(size_t)bias);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_390,"Result",&local_3fa);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"Result",&local_3fb);
    pCVar5 = local_410;
    LogImage::LogImage((LogImage *)&cmpPix,&local_390,&local_2b0,local_410,&local_3e8,&local_3d8,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)&cmpPix,iVar8,__buf_02,(size_t)pCVar5);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"ErrorMask",&local_3fc);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"Error mask",&local_3fd)
    ;
    pCVar5 = &errorMask.super_ConstPixelBufferAccess;
    LogImage::LogImage((LogImage *)&diff,&local_2d0,&local_2f0,pCVar5,QP_IMAGE_COMPRESSION_MODE_BEST
                      );
    LogImage::write((LogImage *)&diff,iVar8,__buf_03,(size_t)pCVar5);
    TestLog::endImageSet(this);
    LogImage::~LogImage((LogImage *)&diff);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_2d0);
    LogImage::~LogImage((LogImage *)&cmpPix);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_390);
    LogImageSet::~LogImageSet((LogImageSet *)local_330);
    std::__cxx11::string::~string((string *)&local_370);
    this_00 = &local_350;
  }
  else {
    if (logMode != COMPARE_LOG_RESULT) goto LAB_007a6f04;
    if (((local_410->m_format).order != RGBA) || ((local_410->m_format).type != UNORM_INT8)) {
      computePixelScaleBias(local_410,&local_3e8,&local_3d8);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_330,local_3b8,(allocator<char> *)&local_2b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_350,local_3c0,(allocator<char> *)&local_2d0);
    LogImageSet::LogImageSet((LogImageSet *)&diff,(string *)local_330,&local_350);
    LogImageSet::write((LogImageSet *)&diff,iVar8,__buf,(size_t)bias);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_370,"Result",(allocator<char> *)&local_2f0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_390,"Result",&local_411);
    pCVar5 = local_410;
    LogImage::LogImage((LogImage *)&cmpPix,&local_370,&local_390,local_410,&local_3e8,&local_3d8,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)&cmpPix,iVar8,__buf_00,(size_t)pCVar5);
    TestLog::endImageSet(this);
    LogImage::~LogImage((LogImage *)&cmpPix);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_370);
    LogImageSet::~LogImageSet((LogImageSet *)&diff);
    std::__cxx11::string::~string((string *)&local_350);
    this_00 = (string *)local_330;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_007a6f04:
  TextureLevel::~TextureLevel(&errorMaskStorage);
  return bVar2;
}

Assistant:

bool floatThresholdCompare (TestLog& log, const char* imageSetName, const char* imageSetDesc, const Vec4& reference, const ConstPixelBufferAccess& result, const Vec4& threshold, CompareLogMode logMode)
{
	const int			width				= result.getWidth();
	const int			height				= result.getHeight();
	const int			depth				= result.getDepth();

	TextureLevel		errorMaskStorage	(TextureFormat(TextureFormat::RGB, TextureFormat::UNORM_INT8), width, height, depth);
	PixelBufferAccess	errorMask			= errorMaskStorage.getAccess();
	Vec4				maxDiff				(0.0f, 0.0f, 0.0f, 0.0f);
	Vec4				pixelBias			(0.0f, 0.0f, 0.0f, 0.0f);
	Vec4				pixelScale			(1.0f, 1.0f, 1.0f, 1.0f);

	for (int z = 0; z < depth; z++)
	{
		for (int y = 0; y < height; y++)
		{
			for (int x = 0; x < width; x++)
			{
				const Vec4	cmpPix		= result.getPixel(x, y, z);
				const Vec4	diff		= abs(reference - cmpPix);
				const bool	isOk		= boolAll(lessThanEqual(diff, threshold));

				maxDiff = max(maxDiff, diff);

				errorMask.setPixel(isOk ? Vec4(0.0f, 1.0f, 0.0f, 1.0f) : Vec4(1.0f, 0.0f, 0.0f, 1.0f), x, y, z);
			}
		}
	}

	bool compareOk = boolAll(lessThanEqual(maxDiff, threshold));

	if (!compareOk || logMode == COMPARE_LOG_EVERYTHING)
	{
		// All formats except normalized unsigned fixed point ones need remapping in order to fit into unorm channels in logged images.
		if (tcu::getTextureChannelClass(result.getFormat().type) != tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)
		{
			computeScaleAndBias(result, result, pixelScale, pixelBias);
			log << TestLog::Message << "Result image is normalized with formula p * " << pixelScale << " + " << pixelBias << TestLog::EndMessage;
		}

		if (!compareOk)
			log << TestLog::Message << "Image comparison failed: max difference = " << maxDiff << ", threshold = " << threshold << ", reference = " << reference << TestLog::EndMessage;

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::Image("ErrorMask",	"Error mask",	errorMask)
			<< TestLog::EndImageSet;
	}
	else if (logMode == COMPARE_LOG_RESULT)
	{
		if (result.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8))
			computePixelScaleBias(result, pixelScale, pixelBias);

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::EndImageSet;
	}

	return compareOk;
}